

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

ImVec2 __thiscall BoardView::CoordToScreen(BoardView *this,float x,float y,float w)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  ImVec2 IVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar9 = -this->m_scale;
  fVar7 = this->m_scale;
  if (this->m_current_side != 0) {
    fVar7 = fVar9;
  }
  uVar1 = this->m_dx;
  uVar3 = this->m_dy;
  uVar2 = this->m_mx;
  uVar4 = this->m_my;
  fVar7 = fVar7 * (x + w * ((float)uVar1 - (float)uVar2));
  fVar9 = fVar9 * (y + w * ((float)uVar3 - (float)uVar4));
  iVar5 = this->m_rotation;
  fVar8 = fVar9;
  if (iVar5 != 0) {
    if (iVar5 == 2) {
      return (ImVec2)(CONCAT44(fVar9,fVar7) ^ 0x8000000080000000);
    }
    if (iVar5 == 1) {
      return (ImVec2)(CONCAT44(fVar7,fVar9) ^ 0x80000000);
    }
    fVar8 = -fVar7;
    fVar7 = fVar9;
  }
  IVar6.y = fVar8;
  IVar6.x = fVar7;
  return IVar6;
}

Assistant:

ImVec2 BoardView::CoordToScreen(float x, float y, float w) {
	float side = m_current_side ? -1.0f : 1.0f;
	float tx   = side * m_scale * (x + w * (m_dx - m_mx));
	float ty   = -1.0f * m_scale * (y + w * (m_dy - m_my));
	switch (m_rotation) {
		case 0: return ImVec2(tx, ty);
		case 1: return ImVec2(-ty, tx);
		case 2: return ImVec2(-tx, -ty);
		default: return ImVec2(ty, -tx);
	}
}